

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O0

void __thiscall ECDSATest_BuiltinCurves_Test::TestBody(ECDSATest_BuiltinCurves_Test *this)

{
  allocator<unsigned_char> *paVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  pointer peVar5;
  pointer peVar6;
  pointer peVar7;
  undefined4 extraout_var;
  uchar *puVar8;
  undefined4 extraout_var_00;
  size_type sVar9;
  ECDSA_SIG *__p;
  pointer peVar10;
  ECDSA_SIG *pEVar11;
  pointer in_R9;
  string local_7a8;
  AssertHelper local_788;
  Message local_780;
  bool local_771;
  undefined1 local_770 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_740;
  Message local_738;
  bool local_729;
  undefined1 local_728 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_6f8;
  Message local_6f0;
  bool local_6e1;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_6b0;
  Message local_6a8;
  bool local_699;
  undefined1 local_698 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_668;
  Message local_660;
  int local_654;
  undefined1 local_650 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_620;
  Message local_618;
  undefined1 local_610 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_5e0;
  Message local_5d8;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__16;
  UniquePtr<ECDSA_SIG> ecdsa_sig;
  AssertHelper local_598;
  Message local_590;
  bool local_581;
  undefined1 local_580 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_550;
  Message local_548;
  bool local_539;
  undefined1 local_538 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_508;
  Message local_500;
  bool local_4f1;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_4c0;
  Message local_4b8;
  int local_4ac;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__12;
  Message local_490;
  Span<const_unsigned_char> local_488;
  Bytes local_478;
  Span<const_unsigned_char> local_468;
  Bytes local_458;
  undefined1 local_448 [8];
  AssertionResult gtest_ar;
  AssertHelper local_418;
  Message local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__11;
  undefined1 local_3e8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature2;
  AssertHelper local_3b0;
  Message local_3a8;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__10;
  uint sig_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  AssertHelper local_348;
  Message local_340;
  int local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_300;
  Message local_2f8;
  int local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2b8;
  Message local_2b0;
  int local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_270;
  Message local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<EC_KEY> wrong_eckey;
  AssertHelper local_228;
  Message local_220;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1e0;
  Message local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_198;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<EC_KEY> eckey;
  BIGNUM *order;
  AssertHelper local_148;
  Message local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__2;
  unique_ptr<ec_group_st,_bssl::internal::Deleter> local_120;
  UniquePtr<EC_GROUP> group;
  ScopedTrace gtest_trace_163;
  anon_struct_16_2_20c53419 *curve;
  anon_struct_16_2_20c53419 *__end1;
  anon_struct_16_2_20c53419 *__begin1;
  anon_struct_16_2_20c53419 (*__range1) [5];
  AssertHelper local_d0;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  string local_a0;
  AssertHelper local_80;
  Message local_78 [3];
  int local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  uint8_t wrong_digest [20];
  uchar local_28 [8];
  uint8_t digest [20];
  ECDSATest_BuiltinCurves_Test *this_local;
  
  unique0x10003375 = this;
  local_5c = RAND_bytes(local_28,0x14);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_58,&local_5c,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar2) {
    testing::Message::Message(local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_58,(AssertionResult *)"RAND_bytes(digest, 20)","false",
               "true",(char *)in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(local_78);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_bc = RAND_bytes((uchar *)&gtest_ar_.message_,0x14);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_b8,&local_bc,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar2) {
      testing::Message::Message(&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&__range1,(internal *)local_b8,
                 (AssertionResult *)"RAND_bytes(wrong_digest, 20)","false","true",(char *)in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                 ,0x94,pcVar4);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      std::__cxx11::string::~string((string *)&__range1);
      testing::Message::~Message(&local_c8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      for (__end1 = TestBody::kCurves; __end1 != (anon_struct_16_2_20c53419 *)&vtable;
          __end1 = __end1 + 1) {
        testing::ScopedTrace::ScopedTrace
                  ((ScopedTrace *)
                   ((long)&group._M_t.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl + 7),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                   ,0xa3,__end1->name);
        std::unique_ptr<ec_group_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)&local_120);
        if (__end1->nid == 0x2c5) {
          NewSecp160r1Group();
          std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::operator=
                    (&local_120,
                     (unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
          std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
        }
        else {
          peVar5 = (pointer)EC_GROUP_new_by_curve_name(__end1->nid);
          std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::reset(&local_120,peVar5);
        }
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<ec_group_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_138,&local_120,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar2) {
          testing::Message::Message(&local_140);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&order,(internal *)local_138,(AssertionResult *)0x8b1f08,"false",
                     "true",(char *)in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xab,pcVar4);
          testing::internal::AssertHelper::operator=(&local_148,&local_140);
          testing::internal::AssertHelper::~AssertHelper(&local_148);
          std::__cxx11::string::~string((string *)&order);
          testing::Message::~Message(&local_140);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          peVar5 = std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::get(&local_120);
          peVar6 = (pointer)EC_GROUP_get0_order(peVar5);
          peVar7 = (pointer)EC_KEY_new();
          std::unique_ptr<ec_key_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,peVar7);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_188,
                     (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                     (type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
          if (!bVar2) {
            testing::Message::Message(&local_190);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__4.message_,(internal *)local_188,
                       (AssertionResult *)0x858e95,"false","true",(char *)in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_198,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                       ,0xb0,pcVar4);
            testing::internal::AssertHelper::operator=(&local_198,&local_190);
            testing::internal::AssertHelper::~AssertHelper(&local_198);
            std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_190);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                &gtest_ar__3.message_);
            peVar5 = std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::get(&local_120);
            local_1cc = EC_KEY_set_group((EC_KEY *)peVar7,(EC_GROUP *)peVar5);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1c8,&local_1cc,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
            if (!bVar2) {
              testing::Message::Message(&local_1d8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__5.message_,(internal *)local_1c8,
                         (AssertionResult *)"EC_KEY_set_group(eckey.get(), group.get())","false",
                         "true",(char *)in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1e0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xb1,pcVar4);
              testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
              testing::internal::AssertHelper::~AssertHelper(&local_1e0);
              std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_1d8);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__3.message_);
              local_214 = EC_KEY_generate_key((EC_KEY *)peVar7);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_210,&local_214,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
              if (!bVar2) {
                testing::Message::Message(&local_220);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&wrong_eckey,(internal *)local_210,
                           (AssertionResult *)"EC_KEY_generate_key(eckey.get())","false","true",
                           (char *)in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_228,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xb2,pcVar4);
                testing::internal::AssertHelper::operator=(&local_228,&local_220);
                testing::internal::AssertHelper::~AssertHelper(&local_228);
                std::__cxx11::string::~string((string *)&wrong_eckey);
                testing::Message::~Message(&local_220);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                peVar7 = (pointer)EC_KEY_new();
                std::unique_ptr<ec_key_st,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&gtest_ar__6.message_,
                           peVar7);
                testing::AssertionResult::
                AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
                          ((AssertionResult *)local_260,
                           (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                           (type *)0x0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_260);
                if (!bVar2) {
                  testing::Message::Message(&local_268);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__7.message_,(internal *)local_260,
                             (AssertionResult *)"wrong_eckey","false","true",(char *)in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_270,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                             ,0xb6,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_270,&local_268);
                  testing::internal::AssertHelper::~AssertHelper(&local_270);
                  std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                  testing::Message::~Message(&local_268);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__6.message_);
                  peVar5 = std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::get(&local_120);
                  local_2a4 = EC_KEY_set_group((EC_KEY *)peVar7,(EC_GROUP *)peVar5);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_2a0,&local_2a4,(type *)0x0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2a0);
                  if (!bVar2) {
                    testing::Message::Message(&local_2b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__8.message_,(internal *)local_2a0,
                               (AssertionResult *)"EC_KEY_set_group(wrong_eckey.get(), group.get())"
                               ,"false","true",(char *)in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                               ,0xb7,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
                    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_2b0);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__6.message_);
                    local_2ec = EC_KEY_generate_key((EC_KEY *)peVar7);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_2e8,&local_2ec,(type *)0x0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2e8);
                    if (!bVar2) {
                      testing::Message::Message(&local_2f8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__9.message_,(internal *)local_2e8,
                                 (AssertionResult *)"EC_KEY_generate_key(wrong_eckey.get())","false"
                                 ,"true",(char *)in_R9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_300,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                 ,0xb8,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
                      testing::internal::AssertHelper::~AssertHelper(&local_300);
                      std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                      testing::Message::~Message(&local_2f8);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
                      local_334 = EC_KEY_check_key((EC_KEY *)peVar7);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_330,&local_334,(type *)0x0);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_330);
                      if (!bVar2) {
                        testing::Message::Message(&local_340);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)
                                   &signature.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (internal *)local_330,
                                   (AssertionResult *)"EC_KEY_check_key(eckey.get())","false","true"
                                   ,(char *)in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_348,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                   ,0xbb,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_348,&local_340);
                        testing::internal::AssertHelper::~AssertHelper(&local_348);
                        std::__cxx11::string::~string
                                  ((string *)
                                   &signature.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        testing::Message::~Message(&local_340);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
                      peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
                      iVar3 = ECDSA_size((EC_KEY *)peVar7);
                      paVar1 = (allocator<unsigned_char> *)
                               ((long)&gtest_ar__10.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               + 7);
                      std::allocator<unsigned_char>::allocator(paVar1);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_len,
                                 CONCAT44(extraout_var,iVar3),paVar1);
                      std::allocator<unsigned_char>::~allocator
                                ((allocator<unsigned_char> *)
                                 ((long)&gtest_ar__10.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 7));
                      puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &sig_len);
                      in_R9 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__3.message_);
                      local_39c = ECDSA_sign(0,local_28,0x14,puVar8,(uint *)&gtest_ar__10.message_,
                                             (EC_KEY *)in_R9);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_398,&local_39c,(type *)0x0);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_398);
                      if (!bVar2) {
                        testing::Message::Message(&local_3a8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)
                                   &signature2.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (internal *)local_398,
                                   (AssertionResult *)
                                   "ECDSA_sign(0, digest, 20, signature.data(), &sig_len, eckey.get())"
                                   ,"false","true",(char *)in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3b0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                   ,0xc2,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
                        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                        std::__cxx11::string::~string
                                  ((string *)
                                   &signature2.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        testing::Message::~Message(&local_3a8);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar2;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_len
                                   ,(ulong)(uint)gtest_ar__10.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl);
                        peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__3.message_);
                        iVar3 = ECDSA_size((EC_KEY *)peVar7);
                        paVar1 = (allocator<unsigned_char> *)
                                 ((long)&gtest_ar__11.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 7);
                        std::allocator<unsigned_char>::allocator(paVar1);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_3e8,CONCAT44(extraout_var_00,iVar3),paVar1);
                        std::allocator<unsigned_char>::~allocator
                                  ((allocator<unsigned_char> *)
                                   ((long)&gtest_ar__11.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   + 7));
                        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )local_3e8);
                        in_R9 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__3.message_);
                        local_404 = ECDSA_sign(0,local_28,0x14,puVar8,(uint *)&gtest_ar__10.message_
                                               ,(EC_KEY *)in_R9);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_400,&local_404,(type *)0x0);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_400);
                        if (!bVar2) {
                          testing::Message::Message(&local_410);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar.message_,(internal *)local_400,
                                     (AssertionResult *)
                                     "ECDSA_sign(0, digest, 20, signature2.data(), &sig_len, eckey.get())"
                                     ,"false","true",(char *)in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_418,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                     ,0xc9,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_418,&local_410);
                          testing::internal::AssertHelper::~AssertHelper(&local_418);
                          std::__cxx11::string::~string((string *)&gtest_ar.message_);
                          testing::Message::~Message(&local_410);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar2;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_3e8,
                                     (ulong)(uint)gtest_ar__10.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                          bssl::Span<unsigned_char_const>::
                          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ((Span<unsigned_char_const> *)&local_468,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &sig_len);
                          Bytes::Bytes(&local_458,local_468);
                          bssl::Span<unsigned_char_const>::
                          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ((Span<unsigned_char_const> *)&local_488,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_3e8);
                          Bytes::Bytes(&local_478,local_488);
                          testing::internal::CmpHelperNE<Bytes,Bytes>
                                    ((internal *)local_448,"Bytes(signature)","Bytes(signature2)",
                                     &local_458,&local_478);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_448);
                          if (!bVar2) {
                            testing::Message::Message(&local_490);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_448);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__12.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                       ,0xcb,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__12.message_,&local_490);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__12.message_);
                            testing::Message::~Message(&local_490);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
                          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&sig_len);
                          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&sig_len);
                          peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__3.message_);
                          local_4ac = ECDSA_verify(0,local_28,0x14,puVar8,(int)sVar9,
                                                   (EC_KEY *)peVar7);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_4a8,&local_4ac,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_4a8);
                          if (!bVar2) {
                            testing::Message::Message(&local_4b8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__13.message_,(internal *)local_4a8,
                                       (AssertionResult *)
                                       "ECDSA_verify(0, digest, 20, signature.data(), signature.size(), eckey.get())"
                                       ,"false","true",(char *)peVar7);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_4c0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                       ,0xcf,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
                            testing::internal::AssertHelper::~AssertHelper(&local_4c0);
                            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                            testing::Message::~Message(&local_4b8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
                          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&sig_len);
                          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&sig_len);
                          peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__6.message_);
                          iVar3 = ECDSA_verify(0,local_28,0x14,puVar8,(int)sVar9,(EC_KEY *)peVar7);
                          local_4f1 = iVar3 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_4f0,&local_4f1,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_4f0);
                          if (!bVar2) {
                            testing::Message::Message(&local_500);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__14.message_,(internal *)local_4f0,
                                       (AssertionResult *)
                                       "ECDSA_verify(0, digest, 20, signature.data(), signature.size(), wrong_eckey.get())"
                                       ,"true","false",(char *)peVar7);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_508,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                       ,0xd3,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_508,&local_500);
                            testing::internal::AssertHelper::~AssertHelper(&local_508);
                            std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                            testing::Message::~Message(&local_500);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
                          ERR_clear_error();
                          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&sig_len);
                          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&sig_len);
                          peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__3.message_);
                          iVar3 = ECDSA_verify(0,(uchar *)&gtest_ar_.message_,0x14,puVar8,(int)sVar9
                                               ,(EC_KEY *)peVar7);
                          local_539 = iVar3 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_538,&local_539,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_538);
                          if (!bVar2) {
                            testing::Message::Message(&local_548);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__15.message_,(internal *)local_538,
                                       (AssertionResult *)
                                       "ECDSA_verify(0, wrong_digest, 20, signature.data(), signature.size(), eckey.get())"
                                       ,"true","false",(char *)peVar7);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_550,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                       ,0xd8,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_550,&local_548);
                            testing::internal::AssertHelper::~AssertHelper(&local_550);
                            std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                            testing::Message::~Message(&local_548);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
                          ERR_clear_error();
                          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&sig_len);
                          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&sig_len);
                          in_R9 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                             &gtest_ar__3.message_);
                          iVar3 = ECDSA_verify(0,local_28,0x14,puVar8,(int)sVar9 + -1,
                                               (EC_KEY *)in_R9);
                          local_581 = iVar3 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_580,&local_581,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_580);
                          if (!bVar2) {
                            testing::Message::Message(&local_590);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&ecdsa_sig,(internal *)local_580,
                                       (AssertionResult *)
                                       "ECDSA_verify(0, digest, 20, signature.data(), signature.size() - 1, eckey.get())"
                                       ,"true","false",(char *)in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_598,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                       ,0xdd,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_598,&local_590);
                            testing::internal::AssertHelper::~AssertHelper(&local_598);
                            std::__cxx11::string::~string((string *)&ecdsa_sig);
                            testing::Message::~Message(&local_590);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
                          ERR_clear_error();
                          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&sig_len);
                          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&sig_len);
                          __p = ECDSA_SIG_from_bytes(puVar8,sVar9);
                          std::unique_ptr<ecdsa_sig_st,bssl::internal::Deleter>::
                          unique_ptr<bssl::internal::Deleter,void>
                                    ((unique_ptr<ecdsa_sig_st,bssl::internal::Deleter> *)
                                     &gtest_ar__16.message_,__p);
                          testing::AssertionResult::
                          AssertionResult<std::unique_ptr<ecdsa_sig_st,bssl::internal::Deleter>>
                                    ((AssertionResult *)local_5d0,
                                     (unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__16.message_,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_5d0);
                          if (!bVar2) {
                            testing::Message::Message(&local_5d8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__17.message_,(internal *)local_5d0,
                                       (AssertionResult *)"ecdsa_sig","false","true",(char *)in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_5e0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                       ,0xe3,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
                            testing::internal::AssertHelper::~AssertHelper(&local_5e0);
                            std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                            testing::Message::~Message(&local_5d8);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar2;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            peVar10 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                            peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__3.message_);
                            in_R9 = peVar6;
                            TestTamperedSig(kEncodedAPI,local_28,0x14,peVar10,peVar7,
                                            (BIGNUM *)peVar6);
                            peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__3.message_);
                            pEVar11 = ECDSA_do_sign(local_28,0x14,(EC_KEY *)peVar7);
                            std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::reset
                                      ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__16.message_,(pointer)pEVar11);
                            testing::AssertionResult::
                            AssertionResult<std::unique_ptr<ecdsa_sig_st,bssl::internal::Deleter>>
                                      ((AssertionResult *)local_610,
                                       (unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__16.message_,(type *)0x0);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_610);
                            if (!bVar2) {
                              testing::Message::Message(&local_618);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__18.message_,(internal *)local_610,
                                         (AssertionResult *)"ecdsa_sig","false","true",(char *)in_R9
                                        );
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_620,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                         ,0xea,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_620,&local_618);
                              testing::internal::AssertHelper::~AssertHelper(&local_620);
                              std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
                              testing::Message::~Message(&local_618);
                            }
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar2;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_610)
                            ;
                            if (gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              pEVar11 = (ECDSA_SIG *)
                                        std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get
                                                  ((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__3.message_);
                              local_654 = ECDSA_do_verify(local_28,0x14,pEVar11,(EC_KEY *)peVar7);
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_650,&local_654,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_650);
                              if (!bVar2) {
                                testing::Message::Message(&local_660);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__19.message_,(internal *)local_650,
                                           (AssertionResult *)
                                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get())"
                                           ,"false","true",(char *)in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_668,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                           ,0xed,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_668,&local_660);
                                testing::internal::AssertHelper::~AssertHelper(&local_668);
                                std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
                                testing::Message::~Message(&local_660);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_650);
                              pEVar11 = (ECDSA_SIG *)
                                        std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get
                                                  ((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__6.message_);
                              iVar3 = ECDSA_do_verify(local_28,0x14,pEVar11,(EC_KEY *)peVar7);
                              local_699 = iVar3 == 0;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_698,&local_699,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_698);
                              if (!bVar2) {
                                testing::Message::Message(&local_6a8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__20.message_,(internal *)local_698,
                                           (AssertionResult *)
                                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), wrong_eckey.get())"
                                           ,"true","false",(char *)in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_6b0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                           ,0xf1,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_6b0,&local_6a8);
                                testing::internal::AssertHelper::~AssertHelper(&local_6b0);
                                std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
                                testing::Message::~Message(&local_6a8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_698);
                              ERR_clear_error();
                              pEVar11 = (ECDSA_SIG *)
                                        std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get
                                                  ((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__3.message_);
                              iVar3 = ECDSA_do_verify((uchar *)&gtest_ar_.message_,0x14,pEVar11,
                                                      (EC_KEY *)peVar7);
                              local_6e1 = iVar3 == 0;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_6e0,&local_6e1,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_6e0);
                              if (!bVar2) {
                                testing::Message::Message(&local_6f0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__21.message_,(internal *)local_6e0,
                                           (AssertionResult *)
                                           "ECDSA_do_verify(wrong_digest, 20, ecdsa_sig.get(), eckey.get())"
                                           ,"true","false",(char *)in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_6f8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                           ,0xf6,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
                                testing::internal::AssertHelper::~AssertHelper(&local_6f8);
                                std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
                                testing::Message::~Message(&local_6f0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_6e0);
                              ERR_clear_error();
                              peVar10 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get
                                                  ((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__3.message_);
                              TestTamperedSig(kRawAPI,local_28,0x14,peVar10,peVar7,(BIGNUM *)peVar6)
                              ;
                              peVar10 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::
                                        operator->((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              BN_set_negative((BIGNUM *)peVar10->r,1);
                              pEVar11 = (ECDSA_SIG *)
                                        std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get
                                                  ((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              peVar7 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__3.message_);
                              iVar3 = ECDSA_do_verify(local_28,0x14,pEVar11,(EC_KEY *)peVar7);
                              local_729 = iVar3 == 0;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_728,&local_729,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_728);
                              in_R9 = peVar6;
                              if (!bVar2) {
                                testing::Message::Message(&local_738);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__22.message_,(internal *)local_728,
                                           (AssertionResult *)
                                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get())"
                                           ,"true","false",(char *)peVar6);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_740,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                           ,0xfe,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_740,&local_738);
                                testing::internal::AssertHelper::~AssertHelper(&local_740);
                                std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
                                testing::Message::~Message(&local_738);
                                in_R9 = peVar6;
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_728);
                              peVar10 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::
                                        operator->((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              BN_set_negative((BIGNUM *)peVar10->r,0);
                              peVar10 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::
                                        operator->((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              BN_set_negative((BIGNUM *)peVar10->s,1);
                              pEVar11 = (ECDSA_SIG *)
                                        std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get
                                                  ((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              peVar6 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__3.message_);
                              iVar3 = ECDSA_do_verify(local_28,0x14,pEVar11,(EC_KEY *)peVar6);
                              local_771 = iVar3 == 0;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_770,&local_771,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_770);
                              if (!bVar2) {
                                testing::Message::Message(&local_780);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&local_7a8,(internal *)local_770,
                                           (AssertionResult *)
                                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get())"
                                           ,"true","false",(char *)in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_788,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                                           ,0x101,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_788,&local_780);
                                testing::internal::AssertHelper::~AssertHelper(&local_788);
                                std::__cxx11::string::~string((string *)&local_7a8);
                                testing::Message::~Message(&local_780);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_770);
                              peVar10 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::
                                        operator->((
                                                  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__16.message_);
                              BN_set_negative((BIGNUM *)peVar10->s,0);
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ = 0;
                            }
                          }
                          std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
                                    ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__16.message_);
                        }
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_3e8);
                      }
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_len);
                    }
                  }
                }
                std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
              }
            }
          }
          std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
        }
        std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr(&local_120);
        testing::ScopedTrace::~ScopedTrace
                  ((ScopedTrace *)
                   ((long)&group._M_t.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl + 7));
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ != 0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

TEST(ECDSATest, BuiltinCurves) {
  // Fill digest values with some random data.
  uint8_t digest[20], wrong_digest[20];
  ASSERT_TRUE(RAND_bytes(digest, 20));
  CONSTTIME_DECLASSIFY(digest, 20);
  ASSERT_TRUE(RAND_bytes(wrong_digest, 20));
  CONSTTIME_DECLASSIFY(wrong_digest, 20);

  static const struct {
    int nid;
    const char *name;
  } kCurves[] = {
      { NID_secp224r1, "secp224r1" },
      { NID_X9_62_prime256v1, "secp256r1" },
      { NID_secp384r1, "secp384r1" },
      { NID_secp521r1, "secp521r1" },
      { NID_secp160r1, "secp160r1" },
  };

  for (const auto &curve : kCurves) {
    SCOPED_TRACE(curve.name);

    bssl::UniquePtr<EC_GROUP> group;
    if (curve.nid == NID_secp160r1) {
      group = NewSecp160r1Group();
    } else {
      group.reset(EC_GROUP_new_by_curve_name(curve.nid));
    }
    ASSERT_TRUE(group);
    const BIGNUM *order = EC_GROUP_get0_order(group.get());

    // Create a new ECDSA key.
    bssl::UniquePtr<EC_KEY> eckey(EC_KEY_new());
    ASSERT_TRUE(eckey);
    ASSERT_TRUE(EC_KEY_set_group(eckey.get(), group.get()));
    ASSERT_TRUE(EC_KEY_generate_key(eckey.get()));

    // Create a second key.
    bssl::UniquePtr<EC_KEY> wrong_eckey(EC_KEY_new());
    ASSERT_TRUE(wrong_eckey);
    ASSERT_TRUE(EC_KEY_set_group(wrong_eckey.get(), group.get()));
    ASSERT_TRUE(EC_KEY_generate_key(wrong_eckey.get()));

    // Check the key.
    EXPECT_TRUE(EC_KEY_check_key(eckey.get()));

    // Test ASN.1-encoded signatures.
    // Create a signature.
    std::vector<uint8_t> signature(ECDSA_size(eckey.get()));
    unsigned sig_len;
    ASSERT_TRUE(
        ECDSA_sign(0, digest, 20, signature.data(), &sig_len, eckey.get()));
    signature.resize(sig_len);

    // ECDSA signing should be non-deterministic. This does not verify k is
    // generated securely but at least checks it was randomized at all.
    std::vector<uint8_t> signature2(ECDSA_size(eckey.get()));
    ASSERT_TRUE(
        ECDSA_sign(0, digest, 20, signature2.data(), &sig_len, eckey.get()));
    signature2.resize(sig_len);
    EXPECT_NE(Bytes(signature), Bytes(signature2));

    // Verify the signature.
    EXPECT_TRUE(ECDSA_verify(0, digest, 20, signature.data(), signature.size(),
                             eckey.get()));

    // Verify the signature with the wrong key.
    EXPECT_FALSE(ECDSA_verify(0, digest, 20, signature.data(), signature.size(),
                              wrong_eckey.get()));
    ERR_clear_error();

    // Verify the signature using the wrong digest.
    EXPECT_FALSE(ECDSA_verify(0, wrong_digest, 20, signature.data(),
                              signature.size(), eckey.get()));
    ERR_clear_error();

    // Verify a truncated signature.
    EXPECT_FALSE(ECDSA_verify(0, digest, 20, signature.data(),
                              signature.size() - 1, eckey.get()));
    ERR_clear_error();

    // Verify a tampered signature.
    bssl::UniquePtr<ECDSA_SIG> ecdsa_sig(
        ECDSA_SIG_from_bytes(signature.data(), signature.size()));
    ASSERT_TRUE(ecdsa_sig);
    TestTamperedSig(kEncodedAPI, digest, 20, ecdsa_sig.get(), eckey.get(),
                    order);

    // Test ECDSA_SIG signing and verification.
    // Create a signature.
    ecdsa_sig.reset(ECDSA_do_sign(digest, 20, eckey.get()));
    ASSERT_TRUE(ecdsa_sig);

    // Verify the signature using the correct key.
    EXPECT_TRUE(ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get()));

    // Verify the signature with the wrong key.
    EXPECT_FALSE(
        ECDSA_do_verify(digest, 20, ecdsa_sig.get(), wrong_eckey.get()));
    ERR_clear_error();

    // Verify the signature using the wrong digest.
    EXPECT_FALSE(
        ECDSA_do_verify(wrong_digest, 20, ecdsa_sig.get(), eckey.get()));
    ERR_clear_error();

    // Verify a tampered signature.
    TestTamperedSig(kRawAPI, digest, 20, ecdsa_sig.get(), eckey.get(), order);

    // Negative components should not be accepted.
    BN_set_negative(ecdsa_sig->r, 1);
    EXPECT_FALSE(ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get()));
    BN_set_negative(ecdsa_sig->r, 0);
    BN_set_negative(ecdsa_sig->s, 1);
    EXPECT_FALSE(ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get()));
    BN_set_negative(ecdsa_sig->s, 0);
  }
}